

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

Tree * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::treeFromString(Interpreter *this,string *s)

{
  basic_substring<const_char> *in_RDX;
  Tree *in_RDI;
  csubstr in_stack_00000aa0;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  std::__cxx11::string::operator[]((ulong)in_RDX);
  std::__cxx11::string::size();
  c4::basic_substring<const_char>::basic_substring
            (in_RDX,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  c4::yml::parse_in_arena(in_stack_00000aa0);
  return in_RDI;
}

Assistant:

const ryml::Tree treeFromString(const std::string& s) {
        return ryml::parse_in_arena(ryml::to_csubstr(s));
    }